

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaSetValidOptions(xmlSchemaValidCtxtPtr ctxt,int options)

{
  int local_20;
  int i;
  int options_local;
  xmlSchemaValidCtxtPtr ctxt_local;
  
  if (ctxt == (xmlSchemaValidCtxtPtr)0x0) {
    ctxt_local._4_4_ = -1;
  }
  else {
    for (local_20 = 1; local_20 < 0x20; local_20 = local_20 + 1) {
      if ((options & 1 << ((byte)local_20 & 0x1f)) != 0) {
        return -1;
      }
    }
    ctxt->options = options;
    ctxt_local._4_4_ = 0;
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlSchemaSetValidOptions(xmlSchemaValidCtxtPtr ctxt,
			 int options)

{
    int i;

    if (ctxt == NULL)
	return (-1);
    /*
    * WARNING: Change the start value if adding to the
    * xmlSchemaValidOption.
    * TODO: Is there an other, more easy to maintain,
    * way?
    */
    for (i = 1; i < (int) sizeof(int) * 8; i++) {
        if (options & 1<<i)
	    return (-1);
    }
    ctxt->options = options;
    return (0);
}